

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O1

void __thiscall mjs::error_object::rethrow(error_object *this)

{
  native_error_type type;
  gc_heap *h;
  native_error_exception *this_00;
  gc_string *pgVar1;
  uint *puVar2;
  gc_heap_ptr_untyped gStack_88;
  wstring_view local_78;
  value local_68;
  undefined8 local_40;
  wchar_t *local_38;
  wstring_view local_30;
  
  h = (this->super_native_object).super_object.heap_;
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  type = *(native_error_type *)&(this->super_native_object).field_0x24;
  pgVar1 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference(&this->stack_trace_,h);
  local_78._M_str = (wchar_t *)(pgVar1 + 1);
  local_78._M_len = (size_t)pgVar1->length_;
  local_40 = 7;
  local_38 = L"message";
  (**(this->super_native_object).super_object._vptr_object)(&local_68,this);
  mjs::to_string((mjs *)&gStack_88,h,&local_68);
  puVar2 = (uint *)gc_heap_ptr_untyped::get(&gStack_88);
  local_30._M_str = (wchar_t *)(puVar2 + 1);
  local_30._M_len = (size_t)*puVar2;
  native_error_exception::native_error_exception(this_00,type,&local_78,&local_30);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

[[noreturn]] void rethrow() const {
        auto& h = heap();
        throw native_error_exception{type_, stack_trace_.dereference(h).view(), mjs::to_string(h, get(L"message")).view()};
    }